

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O2

SourceBuffer * __thiscall
slang::SourceManager::assignText
          (SourceBuffer *__return_storage_ptr__,SourceManager *this,string_view path,
          string_view text,SourceLocation includedFrom,SourceLibrary *library)

{
  atomic<unsigned_int> *paVar1;
  uint __val;
  size_t sVar2;
  _Alloc_hider _Var3;
  string_view bufferPath;
  SmallVector<char,_40UL> buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string temp;
  
  temp._M_dataplus._M_p = (pointer)&temp.field_2;
  temp._M_string_length = 0;
  temp.field_2._M_local_buf[0] = '\0';
  sVar2 = path._M_len;
  _Var3._M_p = path._M_str;
  if (path._M_len == 0) {
    s_abi_cxx11_(&local_70,"<unnamed_buffer",0xf);
    LOCK();
    paVar1 = &this->unnamedBufferCount;
    __val = (paVar1->super___atomic_base<unsigned_int>)._M_i;
    (paVar1->super___atomic_base<unsigned_int>)._M_i =
         (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
    UNLOCK();
    std::__cxx11::to_string(&local_90,__val);
    std::operator+(&local_d0,&local_70,&local_90);
    s_abi_cxx11_(&local_b0,">",1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buffer,
                   &local_d0,&local_b0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&temp,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buffer);
    std::__cxx11::string::~string((string *)&buffer);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    sVar2 = temp._M_string_length;
    _Var3 = temp._M_dataplus;
  }
  buffer.super_SmallVectorBase<char>.data_ = buffer.super_SmallVectorBase<char>.firstElement;
  buffer.super_SmallVectorBase<char>.len = 0;
  buffer.super_SmallVectorBase<char>.cap = 0x28;
  SmallVectorBase<char>::insert<const_char_*>
            (&buffer.super_SmallVectorBase<char>,buffer.super_SmallVectorBase<char>.data_,
             text._M_str,text._M_str + text._M_len);
  if ((buffer.super_SmallVectorBase<char>.len == 0) ||
     (buffer.super_SmallVectorBase<char>.data_[buffer.super_SmallVectorBase<char>.len - 1] != '\0'))
  {
    local_d0._M_dataplus._M_p._0_1_ = 0;
    SmallVectorBase<char>::emplace_back<char>(&buffer.super_SmallVectorBase<char>,(char *)&local_d0)
    ;
  }
  bufferPath._M_str = _Var3._M_p;
  bufferPath._M_len = sVar2;
  assignBuffer(__return_storage_ptr__,this,bufferPath,&buffer,includedFrom,library);
  SmallVectorBase<char>::cleanup(&buffer.super_SmallVectorBase<char>,(EVP_PKEY_CTX *)this);
  std::__cxx11::string::~string((string *)&temp);
  return __return_storage_ptr__;
}

Assistant:

SourceBuffer SourceManager::assignText(std::string_view path, std::string_view text,
                                       SourceLocation includedFrom, const SourceLibrary* library) {
    std::string temp;
    if (path.empty()) {
        using namespace std::literals;
        temp = "<unnamed_buffer"s + std::to_string(unnamedBufferCount++) + ">"s;
        path = temp;
    }

    SmallVector<char> buffer;
    buffer.insert(buffer.end(), text.begin(), text.end());
    if (buffer.empty() || buffer.back() != '\0')
        buffer.push_back('\0');

    return assignBuffer(path, std::move(buffer), includedFrom, library);
}